

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayedObjects.hpp
# Opt level: O2

void __thiscall
gmlc::concurrency::
DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
finishedWithValue(DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *this,int index)

{
  iterator __position;
  key_type local_24;
  
  std::mutex::lock(&this->promiseLock);
  __position = std::
               _Rb_tree<int,_std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::find(&(this->usedPromiseByInteger)._M_t,&local_24);
  if ((_Rb_tree_header *)__position._M_node !=
      &(this->usedPromiseByInteger)._M_t._M_impl.super__Rb_tree_header) {
    std::
    _Rb_tree<int,std::pair<int_const,std::promise<std::__cxx11::string>>,std::_Select1st<std::pair<int_const,std::promise<std::__cxx11::string>>>,std::less<int>,std::allocator<std::pair<int_const,std::promise<std::__cxx11::string>>>>
    ::erase_abi_cxx11_((_Rb_tree<int,std::pair<int_const,std::promise<std::__cxx11::string>>,std::_Select1st<std::pair<int_const,std::promise<std::__cxx11::string>>>,std::less<int>,std::allocator<std::pair<int_const,std::promise<std::__cxx11::string>>>>
                        *)&this->usedPromiseByInteger,__position);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->promiseLock);
  return;
}

Assistant:

void finishedWithValue(int index)
    {
        std::lock_guard<std::mutex> lock(promiseLock);
        auto fnd = usedPromiseByInteger.find(index);
        if (fnd != usedPromiseByInteger.end()) {
            usedPromiseByInteger.erase(fnd);
        }
    }